

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

int __thiscall llvm::APInt::abs(APInt *this,int __x)

{
  bool bVar1;
  undefined4 in_register_00000034;
  APInt *this_00;
  APInt local_28;
  APInt *local_18;
  APInt *this_local;
  
  this_00 = (APInt *)CONCAT44(in_register_00000034,__x);
  local_18 = this_00;
  this_local = this;
  bVar1 = isNegative(this_00);
  if (bVar1) {
    APInt(&local_28,this_00);
    llvm::operator-((llvm *)this,&local_28);
    ~APInt(&local_28);
  }
  else {
    APInt(this,this_00);
  }
  return (int)this;
}

Assistant:

APInt abs() const {
    if (isNegative())
      return -(*this);
    return *this;
  }